

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deltatimes.cpp
# Opt level: O0

void extractDeltaTimesForAllNotes
               (MidiFile *midifile,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *histogram,Options *options)

{
  double dVar1;
  int iVar2;
  Options *pOVar3;
  bool bVar4;
  int iVar5;
  MidiEventList *pMVar6;
  MidiEvent *pMVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  string local_340 [32];
  key_type local_320;
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  stringstream local_2a0 [8];
  stringstream key;
  undefined1 local_290 [376];
  double local_118;
  double value;
  int local_108;
  int j;
  int i;
  byte local_da;
  allocator local_d9;
  undefined1 local_d8 [6];
  bool histogramQ;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  int local_68;
  int lastindex;
  allocator local_51;
  string local_50;
  byte local_2a;
  byte local_29;
  int local_28;
  bool allQ;
  int iStack_24;
  bool realtimeQ;
  int timeFormat;
  int tpq;
  Options *options_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *histogram_local;
  MidiFile *midifile_local;
  
  _timeFormat = options;
  options_local = (Options *)histogram;
  histogram_local =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *)midifile;
  iStack_24 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  pOVar3 = _timeFormat;
  local_28 = 0;
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"all",&local_51);
  bVar4 = smf::Options::getBoolean(pOVar3,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pOVar3 = _timeFormat;
  local_68 = -1;
  if (bVar4) {
    local_29 = 1;
  }
  local_2a = bVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"seconds",&local_89);
  bVar4 = smf::Options::getBoolean(pOVar3,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  pOVar3 = _timeFormat;
  if (bVar4) {
    local_28 = 1;
    local_29 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b0,"milliseconds",&local_b1);
    bVar4 = smf::Options::getBoolean(pOVar3,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    pOVar3 = _timeFormat;
    if (bVar4) {
      local_28 = 2;
      local_29 = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_d8,"quarters",&local_d9);
      bVar4 = smf::Options::getBoolean(pOVar3,(string *)local_d8);
      std::__cxx11::string::~string((string *)local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_d9);
      if (bVar4) {
        local_28 = 3;
      }
    }
  }
  pOVar3 = _timeFormat;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,"count",(allocator *)((long)&j + 3));
  bVar4 = smf::Options::getBoolean(pOVar3,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&j + 3));
  local_da = bVar4;
  if ((local_29 & 1) != 0) {
    smf::MidiFile::doTimeAnalysis((MidiFile *)histogram_local);
  }
  for (local_108 = 0; iVar2 = local_108,
      iVar5 = smf::MidiFile::getTrackCount((MidiFile *)histogram_local), iVar2 < iVar5;
      local_108 = local_108 + 1) {
    local_68 = -1;
    value._4_4_ = 0;
    while( true ) {
      iVar2 = value._4_4_;
      pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
      iVar5 = smf::MidiEventList::getEventCount(pMVar6);
      if (iVar5 <= iVar2) break;
      pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,value._4_4_);
      bVar4 = smf::MidiMessage::isNote(&pMVar7->super_MidiMessage);
      if (bVar4) {
        if (local_68 < 0) {
          local_68 = value._4_4_;
        }
        else {
          std::__cxx11::stringstream::stringstream(local_2a0);
          if ((local_2a & 1) == 0) {
            if ((local_29 & 1) == 0) {
              pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
              pMVar7 = smf::MidiEventList::operator[](pMVar6,value._4_4_);
              iVar2 = pMVar7->tick;
              pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
              pMVar7 = smf::MidiEventList::operator[](pMVar6,local_68);
              local_118 = (double)(iVar2 - pMVar7->tick);
              if (local_28 == 3) {
                local_118 = local_118 / (double)iStack_24;
              }
              std::__cxx11::stringstream::str();
              std::__cxx11::string::clear();
              std::__cxx11::string::~string(local_300);
              std::ostream::operator<<(local_290,local_118);
            }
            else {
              pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
              pMVar7 = smf::MidiEventList::operator[](pMVar6,value._4_4_);
              dVar1 = pMVar7->seconds;
              pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
              pMVar7 = smf::MidiEventList::operator[](pMVar6,local_68);
              local_118 = dVar1 - pMVar7->seconds;
              if (local_28 == 2) {
                local_118 = local_118 * 1000.0;
              }
              std::__cxx11::stringstream::str();
              std::__cxx11::string::clear();
              std::__cxx11::string::~string(local_2e0);
              std::ostream::operator<<(local_290,local_118);
            }
          }
          else {
            std::__cxx11::stringstream::str();
            std::__cxx11::string::clear();
            std::__cxx11::string::~string(local_2c0);
            pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,value._4_4_);
            iVar2 = pMVar7->tick;
            pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,local_68);
            local_118 = (double)(iVar2 - pMVar7->tick);
            poVar8 = (ostream *)std::ostream::operator<<(local_290,local_118);
            std::operator<<(poVar8,"\t");
            poVar8 = (ostream *)std::ostream::operator<<(local_290,local_118 / (double)iStack_24);
            std::operator<<(poVar8,"\t");
            pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,value._4_4_);
            dVar1 = pMVar7->seconds;
            pMVar6 = smf::MidiFile::operator[]((MidiFile *)histogram_local,local_108);
            pMVar7 = smf::MidiEventList::operator[](pMVar6,local_68);
            local_118 = dVar1 - pMVar7->seconds;
            poVar8 = (ostream *)std::ostream::operator<<(local_290,local_118);
            std::operator<<(poVar8,"\t");
            std::ostream::operator<<(local_290,local_118 * 1000.0);
          }
          pOVar3 = options_local;
          if ((local_da & 1) == 0) {
            std::__cxx11::stringstream::str();
            poVar8 = std::operator<<((ostream *)&std::cout,local_340);
            std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_340);
          }
          else {
            std::__cxx11::stringstream::str();
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                                   *)pOVar3,&local_320);
            *pmVar9 = *pmVar9 + 1;
            std::__cxx11::string::~string((string *)&local_320);
          }
          local_68 = value._4_4_;
          std::__cxx11::stringstream::~stringstream(local_2a0);
        }
      }
      value._4_4_ = value._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void extractDeltaTimesForAllNotes(MidiFile& midifile, map<string, int>& histogram,
		Options& options) {
	int tpq = midifile.getTicksPerQuarterNote();
	int timeFormat = TIME_TICKS;
	bool realtimeQ  = false;
	bool allQ = options.getBoolean("all");
	int lastindex = -1;
	if (allQ) {
		realtimeQ = true;
	}
	if (options.getBoolean("seconds")) {
		timeFormat = TIME_SECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("milliseconds")) {
		timeFormat = TIME_MILLISECONDS;
		realtimeQ  = true;
	} else if (options.getBoolean("quarters")) {
		timeFormat = TIME_QUARTERS;
	}
	bool histogramQ = options.getBoolean("count");

	if (realtimeQ) {
		midifile.doTimeAnalysis();
	}

	for (int i=0; i<midifile.getTrackCount(); i++) {
		lastindex = -1;
		for (int j=0; j<midifile[i].getEventCount(); j++) {
			if (!midifile[i][j].isNote()) {
				continue;
			}
			if (lastindex < 0) {
				lastindex = j;
				continue;
			}
			double value;
			stringstream key;
			if (allQ) {
				key.str().clear();
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				key << value << "\t";         // MIDI ticks
				key << value/tpq << "\t";     // quarter notes
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				key << value << "\t";         // seconds
				key << value * 1000.0;        // milliseconds
			} else if (realtimeQ) {
				value = midifile[i][j].seconds - midifile[i][lastindex].seconds;
				if (timeFormat == TIME_MILLISECONDS) {
					value *= 1000.0;
				}
				key.str().clear();
				key << value;
			} else {
				value = midifile[i][j].tick - midifile[i][lastindex].tick;
				if (timeFormat == TIME_QUARTERS) {
					value /= tpq;
				}
				key.str().clear();
				key << value;
			}
			if (histogramQ) {
				histogram[key.str()]++;
			} else {
				cout << key.str() << endl;
			}
			lastindex = j;
		}
	}
}